

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O2

Clause * __thiscall Shell::EqualityProxy::apply(EqualityProxy *this,Clause *cl)

{
  undefined8 uVar1;
  Literal *lit;
  Literal *elem;
  Clause *pCVar2;
  bool bVar3;
  uint i;
  ulong uVar4;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_88;
  NonspecificInference2 local_78;
  Inference local_60;
  
  uVar1 = *(undefined8 *)&cl->field_0x38;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_88);
  bVar3 = false;
  for (uVar4 = 0; ((uint)uVar1 & 0xfffff) != uVar4; uVar4 = uVar4 + 1) {
    lit = cl->_literals[uVar4];
    elem = apply(this,lit);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               local_88._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,elem);
    bVar3 = (bool)(bVar3 | elem != lit);
  }
  pCVar2 = cl;
  if (bVar3) {
    local_78.premise2 = this->_defUnit;
    local_78.rule = EQUALITY_PROXY_REPLACEMENT;
    local_78.premise1 = &cl->super_Unit;
    Kernel::Inference::Inference(&local_60,&local_78);
    pCVar2 = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        local_88._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_60);
    (pCVar2->super_Unit)._inference._age = (cl->super_Unit)._inference._age;
  }
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_88);
  return pCVar2;
}

Assistant:

Clause* EqualityProxy::apply(Clause* cl)
{
  unsigned clen = cl->length();

  RStack<Literal*> resLits;

  bool modified = false;
  for (unsigned i = 0; i < clen ; i++) {
    Literal* lit=(*cl)[i];
    Literal* rlit=apply(lit);
    resLits->push(rlit);
    if (rlit != lit) {
      ASS(lit->isEquality());
      modified = true;
    }
  }
  if (!modified) {
    return cl;
  }

  ASS(_defUnit);

  auto res = Clause::fromStack(*resLits, 
    NonspecificInference2(InferenceRule::EQUALITY_PROXY_REPLACEMENT, cl, _defUnit));
  // TODO isn't this done automatically?
  res->setAge(cl->age());
  return res;
}